

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

uint __thiscall
Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial
          (FBXConverter *this,MeshGeometry *mesh,Model *model,value_type_conflict4 index,
          aiNode *parent,aiNode *root_node,aiMatrix4x4 *absolute_transform)

{
  pointer paVar1;
  pointer paVar2;
  _Rb_tree_header *p_Var3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int *piVar9;
  pointer paVar10;
  pointer paVar11;
  pointer paVar12;
  aiVector3D *paVar13;
  pointer ppBVar14;
  pointer ppBVar15;
  pointer ppSVar16;
  ShapeGeometry *this_00;
  _Base_ptr p_Var17;
  pointer ppaVar18;
  pointer ppaVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  pointer ppaVar24;
  pointer ppaVar25;
  aiAnimMesh *paVar26;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar27;
  aiMesh *out;
  MatIndexArray *pMVar28;
  Skin *pSVar29;
  int *piVar30;
  vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_> *pvVar31
  ;
  aiVector3D *paVar32;
  ulong *puVar33;
  long lVar34;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar35;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar36;
  ulong uVar37;
  void *__s;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pvVar38;
  aiColor4D *paVar39;
  uint *puVar40;
  mapped_type *pmVar41;
  pointer piVar42;
  uint *puVar43;
  pointer ppBVar44;
  pointer ppBVar45;
  aiAnimMesh **ppaVar46;
  undefined4 in_register_0000000c;
  aiFace *paVar47;
  pointer paVar48;
  _Base_ptr p_Var49;
  pointer puVar50;
  Model *model_00;
  ulong uVar51;
  _Rb_tree_header *p_Var52;
  ulong uVar53;
  uint uVar54;
  aiFace *paVar55;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_01;
  aiMesh *paVar56;
  MeshGeometry *geo;
  ulong uVar57;
  uint uVar58;
  bool bVar59;
  float fVar60;
  uint in_cursor;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_190;
  BlendShapeChannel *local_188;
  MeshGeometry *local_180;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_178;
  ulong local_170;
  aiFace *local_168;
  undefined4 local_15c;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_158;
  ulong local_150;
  aiAnimMesh *animMesh;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_140;
  MatIndexArray *local_138;
  MatIndexArray *local_130;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  uint outIndex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> reverseMapping;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempBinormals;
  uint count;
  undefined4 uStack_94;
  ulong local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  aiNode *local_78;
  aiNode *local_70;
  Model *local_68;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  translateIndexMap;
  
  local_188 = (BlendShapeChannel *)CONCAT44(in_register_0000000c,index);
  local_70 = parent;
  local_68 = model;
  out = SetupEmptyMesh(this,&mesh->super_Geometry,parent);
  pMVar28 = MeshGeometry::GetMaterialIndices(mesh);
  local_178 = MeshGeometry::GetVertices(mesh);
  local_190 = MeshGeometry::GetFaceIndexCounts(mesh);
  uVar58 = 0;
  local_15c = 0;
  if (this->doc->settings->readWeights == true) {
    pSVar29 = Geometry::DeformerSkin(&mesh->super_Geometry);
    local_15c = (undefined4)CONCAT71((int7)((ulong)pSVar29 >> 8),pSVar29 != (Skin *)0x0);
  }
  piVar30 = (pMVar28->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  piVar9 = (pMVar28->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar54 = 0;
  if (piVar30 != piVar9) {
    puVar50 = (local_190->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    uVar54 = 0;
    uVar58 = 0;
    do {
      if (*piVar30 == (int)local_188) {
        uVar54 = uVar54 + 1;
        uVar58 = uVar58 + *puVar50;
      }
      piVar30 = piVar30 + 1;
      puVar50 = puVar50 + 1;
    } while (piVar30 != piVar9);
  }
  local_130 = pMVar28;
  if (uVar54 != 0) {
    if (uVar58 == 0) {
      __assert_fail("count_vertices",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                    ,0x50f,
                    "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
                   );
    }
    reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var3 = &translateIndexMap._M_t._M_impl.super__Rb_tree_header;
    translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar37 = (ulong)uVar58;
    translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    if (((char)local_15c != '\0') ||
       (pvVar31 = Geometry::GetBlendShapes(&mesh->super_Geometry),
       (pvVar31->
       super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
       )._M_impl.super__Vector_impl_data._M_finish !=
       (pvVar31->
       super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
       )._M_impl.super__Vector_impl_data._M_start)) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&reverseMapping,uVar37);
    }
    out->mNumVertices = uVar58;
    paVar32 = (aiVector3D *)operator_new__(uVar37 * 0xc);
    memset(paVar32,0,((uVar37 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
    out->mVertices = paVar32;
    out->mNumFaces = uVar54;
    uVar37 = (ulong)uVar54;
    puVar33 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
    *puVar33 = uVar37;
    paVar55 = (aiFace *)(puVar33 + 1);
    paVar47 = paVar55;
    do {
      paVar47->mNumIndices = 0;
      paVar47->mIndices = (uint *)0x0;
      paVar47 = paVar47 + 1;
    } while (paVar47 != (aiFace *)(puVar33 + uVar37 * 2 + 1));
    out->mFaces = paVar55;
    local_78 = root_node;
    local_140 = MeshGeometry::GetNormals(mesh);
    paVar48 = (local_140->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    paVar10 = (local_140->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (paVar48 != paVar10) {
      paVar11 = (local_178->
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                super__Vector_impl_data._M_start;
      paVar12 = (local_178->
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      lVar34 = (long)paVar12 - (long)paVar11;
      if ((long)paVar48 - (long)paVar10 != lVar34) {
        __assert_fail("normals.size() == vertices.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                      ,0x523,
                      "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
                     );
      }
      auVar20._8_8_ = 0;
      auVar20._0_8_ = (lVar34 >> 2) * -0x5555555555555555;
      uVar37 = 0xffffffffffffffff;
      if (SUB168(auVar20 * ZEXT816(0xc),8) == 0) {
        uVar37 = SUB168(auVar20 * ZEXT816(0xc),0);
      }
      paVar32 = (aiVector3D *)operator_new__(uVar37);
      lVar34 = (long)paVar12 - (long)paVar11;
      if (lVar34 != 0) {
        memset(paVar32,0,((lVar34 - 0xcU) / 0xc) * 0xc + 0xc);
      }
      out->mNormals = paVar32;
    }
    pvVar35 = MeshGeometry::GetTangents(mesh);
    local_158 = MeshGeometry::GetBinormals(mesh);
    pvVar27 = local_140;
    tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_180 = mesh;
    local_168 = paVar55;
    if ((pvVar35->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_finish !=
        (pvVar35->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      this_01 = local_158;
      if ((local_158->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish ==
          (local_158->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start) {
        lVar34 = (long)(local_140->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_140->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
        if (lVar34 == 0) {
          this_01 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0;
        }
        else {
          this_01 = &tempBinormals;
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                    (this_01,(lVar34 >> 2) * -0x5555555555555555);
          paVar48 = (pvVar35->
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if ((pvVar35->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish != paVar48) {
            uVar58 = 1;
            uVar37 = 0;
            do {
              paVar10 = (pvVar27->
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              fVar60 = paVar10[uVar37].x;
              fVar4 = paVar10[uVar37].y;
              fVar5 = paVar48[uVar37].z;
              fVar6 = paVar10[uVar37].z;
              fVar7 = paVar48[uVar37].x;
              fVar8 = paVar48[uVar37].y;
              tempBinormals.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start[uVar37].x = fVar4 * fVar5 - fVar8 * fVar6;
              tempBinormals.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start[uVar37].y = fVar6 * fVar7 - fVar5 * fVar60;
              tempBinormals.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start[uVar37].z = fVar60 * fVar8 - fVar7 * fVar4;
              uVar37 = (ulong)uVar58;
              paVar48 = (pvVar35->
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              uVar53 = ((long)(pvVar35->
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)paVar48 >> 2) *
                       -0x5555555555555555;
              uVar58 = uVar58 + 1;
            } while (uVar37 <= uVar53 && uVar53 - uVar37 != 0);
          }
        }
      }
      if (this_01 == (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
        local_158 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0;
      }
      else {
        paVar48 = (local_178->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar10 = (local_178->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        lVar34 = (long)paVar10 - (long)paVar48;
        if (((long)(pvVar35->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar35->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start != lVar34) ||
           ((long)(this_01->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this_01->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start != lVar34)) {
          __assert_fail("tangents.size() == vertices.size() && binormals->size() == vertices.size()"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                        ,0x53e,
                        "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
                       );
        }
        auVar21._8_8_ = 0;
        auVar21._0_8_ = (lVar34 >> 2) * -0x5555555555555555;
        uVar37 = 0xffffffffffffffff;
        if (SUB168(auVar21 * ZEXT816(0xc),8) == 0) {
          uVar37 = SUB168(auVar21 * ZEXT816(0xc),0);
        }
        paVar32 = (aiVector3D *)operator_new__(uVar37);
        lVar34 = (long)paVar10 - (long)paVar48;
        if (lVar34 != 0) {
          memset(paVar32,0,((lVar34 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        out->mTangents = paVar32;
        paVar48 = (local_178->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar10 = (local_178->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = ((long)paVar10 - (long)paVar48 >> 2) * -0x5555555555555555;
        uVar37 = 0xffffffffffffffff;
        if (SUB168(auVar22 * ZEXT816(0xc),8) == 0) {
          uVar37 = SUB168(auVar22 * ZEXT816(0xc),0);
        }
        paVar32 = (aiVector3D *)operator_new__(uVar37);
        lVar34 = (long)paVar10 - (long)paVar48;
        local_158 = this_01;
        if (lVar34 != 0) {
          memset(paVar32,0,((lVar34 - 0xcU) / 0xc) * 0xc + 0xc);
        }
        out->mBitangents = paVar32;
      }
    }
    local_170 = 0x2c;
    do {
      pvVar36 = MeshGeometry::GetTextureCoords(local_180,(int)local_170 - 0x2c);
      if ((pvVar36->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start ==
          (pvVar36->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        local_170 = (ulong)((int)local_170 - 0x2c);
        goto LAB_005f545c;
      }
      paVar48 = (local_178->
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                super__Vector_impl_data._M_start;
      paVar10 = (local_178->
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = ((long)paVar10 - (long)paVar48 >> 2) * -0x5555555555555555;
      uVar37 = SUB168(auVar23 * ZEXT816(0xc),0);
      if (SUB168(auVar23 * ZEXT816(0xc),8) != 0) {
        uVar37 = 0xffffffffffffffff;
      }
      __s = operator_new__(uVar37);
      lVar34 = (long)paVar10 - (long)paVar48;
      if (lVar34 != 0) {
        memset(__s,0,((lVar34 - 0xcU) / 0xc) * 0xc + 0xc);
      }
      *(void **)((long)out + local_170 * 8 + -0xf0) = __s;
      *(undefined4 *)((long)out->mColors + local_170 * 4 + -0x30) = 2;
      local_170 = local_170 + 1;
    } while (local_170 != 0x34);
    local_170 = 8;
LAB_005f545c:
    pMVar28 = local_130;
    local_150 = 0;
    do {
      pvVar38 = MeshGeometry::GetVertexColors(local_180,(uint)local_150);
      if ((pvVar38->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start ==
          (pvVar38->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish) goto LAB_005f5510;
      paVar48 = (local_178->
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                super__Vector_impl_data._M_start;
      paVar10 = (local_178->
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      lVar34 = (long)paVar10 - (long)paVar48 >> 2;
      uVar37 = lVar34 * -0x5555555555555550;
      paVar39 = (aiColor4D *)
                operator_new__(-(ulong)((ulong)(lVar34 * -0x5555555555555555) >> 0x3c != 0) | uVar37
                              );
      if (paVar10 != paVar48) {
        memset(paVar39,0,uVar37);
      }
      out->mColors[local_150] = paVar39;
      local_150 = local_150 + 1;
    } while (local_150 != 8);
    local_150 = 8;
LAB_005f5510:
    in_cursor = 0;
    piVar30 = (pMVar28->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    piVar9 = (pMVar28->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    geo = local_180;
    if (piVar30 != piVar9) {
      puVar43 = (local_190->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_start;
      uVar37 = local_170 & 0xffffffff;
      uVar53 = local_150 & 0xffffffff;
      local_190 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      do {
        paVar47 = local_168;
        uVar58 = *puVar43;
        pMVar28 = (MatIndexArray *)(ulong)uVar58;
        if (*piVar30 == (int)local_188) {
          local_168->mNumIndices = uVar58;
          puVar40 = (uint *)operator_new__((long)pMVar28 * 4);
          paVar47->mIndices = puVar40;
          uVar54 = 8;
          if (uVar58 - 1 < 3) {
            uVar54 = *(uint *)(&DAT_0070c750 + (ulong)(uVar58 - 1) * 4);
          }
          paVar47 = local_168 + 1;
          out->mPrimitiveTypes = uVar54 | out->mPrimitiveTypes;
          local_138 = pMVar28;
          if (uVar58 != 0) {
            pMVar28 = (MatIndexArray *)0x0;
            do {
              local_168->mIndices[(long)pMVar28] = (uint)local_190;
              uVar51 = (ulong)local_190 & 0xffffffff;
              local_130 = pMVar28;
              if (reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar51] = in_cursor;
                pmVar41 = std::
                          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          ::operator[](&translateIndexMap,&in_cursor);
                *pmVar41 = (mapped_type)local_190;
              }
              uVar57 = (ulong)in_cursor;
              paVar48 = (local_178->
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              paVar32 = out->mVertices;
              paVar32[uVar51].z = paVar48[uVar57].z;
              paVar48 = paVar48 + uVar57;
              fVar60 = paVar48->y;
              paVar32 = paVar32 + uVar51;
              paVar32->x = paVar48->x;
              paVar32->y = fVar60;
              paVar32 = out->mNormals;
              if (paVar32 != (aiVector3D *)0x0) {
                paVar48 = (local_140->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                paVar32[uVar51].z = paVar48[uVar57].z;
                paVar48 = paVar48 + uVar57;
                fVar60 = paVar48->y;
                paVar32[uVar51].x = paVar48->x;
                paVar32[uVar51].y = fVar60;
              }
              paVar32 = out->mTangents;
              if (paVar32 != (aiVector3D *)0x0) {
                paVar48 = (pvVar35->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                paVar32[uVar51].z = paVar48[uVar57].z;
                paVar48 = paVar48 + uVar57;
                fVar60 = paVar48->y;
                paVar32[uVar51].x = paVar48->x;
                paVar32[uVar51].y = fVar60;
                paVar48 = (local_158->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                paVar32 = out->mBitangents;
                paVar32[uVar51].z = paVar48[uVar57].z;
                paVar48 = paVar48 + uVar57;
                fVar60 = paVar48->y;
                paVar32 = paVar32 + uVar51;
                paVar32->x = paVar48->x;
                paVar32->y = fVar60;
              }
              if ((float)local_170 != 0.0) {
                uVar57 = 0;
                do {
                  pvVar36 = MeshGeometry::GetTextureCoords(local_180,(uint)uVar57);
                  paVar1 = (pvVar36->
                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + in_cursor;
                  fVar60 = paVar1->y;
                  paVar13 = out->mTextureCoords[uVar57];
                  paVar32 = paVar13 + uVar51;
                  paVar32->x = paVar1->x;
                  paVar32->y = fVar60;
                  paVar13[uVar51].z = 0.0;
                  uVar57 = uVar57 + 1;
                } while (uVar37 != uVar57);
              }
              if ((float)local_150 != 0.0) {
                uVar57 = 0;
                do {
                  pvVar38 = MeshGeometry::GetVertexColors(local_180,(uint)uVar57);
                  paVar2 = (pvVar38->
                           super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)
                           ._M_impl.super__Vector_impl_data._M_start + in_cursor;
                  fVar60 = paVar2->g;
                  fVar4 = paVar2->b;
                  fVar5 = paVar2->a;
                  paVar39 = out->mColors[uVar57] + uVar51;
                  paVar39->r = paVar2->r;
                  paVar39->g = fVar60;
                  paVar39->b = fVar4;
                  paVar39->a = fVar5;
                  uVar57 = uVar57 + 1;
                } while (uVar53 != uVar57);
              }
              pMVar28 = (MatIndexArray *)
                        ((long)&(local_130->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + 1);
              local_190 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          (ulong)((int)local_190 + 1);
              in_cursor = in_cursor + 1;
              geo = local_180;
            } while (pMVar28 != local_138);
          }
        }
        else {
          in_cursor = in_cursor + uVar58;
        }
        local_168 = paVar47;
        piVar30 = piVar30 + 1;
        puVar43 = puVar43 + 1;
      } while (piVar30 != piVar9);
    }
    paVar56 = out;
    ConvertMaterialForMesh(this,out,local_68,geo,(value_type_conflict4)local_188);
    if ((char)local_15c != '\0') {
      paVar56 = out;
      ConvertWeights(this,out,model_00,geo,absolute_transform,local_70,local_78,(uint)local_188,
                     &reverseMapping);
    }
    animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar31 = Geometry::GetBlendShapes(&geo->super_Geometry);
    ppBVar14 = (pvVar31->
               super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    ppaVar24 = animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppaVar25 = animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    for (ppBVar45 = (pvVar31->
                    super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start = ppaVar24,
        animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppaVar25, ppBVar45 != ppBVar14; ppBVar45 = ppBVar45 + 1)
    {
      ppBVar15 = ((*ppBVar45)->blendShapeChannels).
                 super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      for (ppBVar44 = ((*ppBVar45)->blendShapeChannels).
                      super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppBVar44 != ppBVar15;
          ppBVar44 = ppBVar44 + 1) {
        local_188 = *ppBVar44;
        if ((local_188->shapeGeometries).
            super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (local_188->shapeGeometries).
            super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar37 = 0;
          do {
            animMesh = aiCreateAnimMesh(out);
            ppSVar16 = (local_188->shapeGeometries).
                       super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(local_188->shapeGeometries).
                              super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar16 >> 3) <=
                uVar37) {
LAB_005f5e33:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar37);
              goto LAB_005f5e44;
            }
            this_00 = ppSVar16[uVar37];
            local_140 = ShapeGeometry::GetVertices(this_00);
            local_158 = ShapeGeometry::GetNormals(this_00);
            local_138 = (MatIndexArray *)ShapeGeometry::GetIndices(this_00);
            paVar26 = animMesh;
            FixAnimMeshName((string *)&count,(FBXConverter *)paVar56,
                            &(this_00->super_Geometry).super_Object.name);
            uVar53 = local_90;
            if (local_90 < 0x400) {
              (paVar26->mName).length = (ai_uint32)local_90;
              memcpy((paVar26->mName).data,(void *)CONCAT44(uStack_94,count),local_90);
              (paVar26->mName).data[uVar53] = '\0';
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(uStack_94,count) != &local_88) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(uStack_94,count),local_88._M_allocated_capacity + 1);
            }
            piVar42 = (local_138->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            if ((local_138->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish != piVar42) {
              uVar53 = 0;
              do {
                paVar48 = (local_140->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                uVar51 = ((long)(local_140->
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)paVar48 >> 2) *
                         -0x5555555555555555;
                if (uVar51 < uVar53 || uVar51 - uVar53 == 0) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar53);
LAB_005f5e22:
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar53);
                  goto LAB_005f5e33;
                }
                paVar10 = (local_158->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                uVar51 = ((long)(local_158->
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)paVar10 >> 2) *
                         -0x5555555555555555;
                if (uVar51 < uVar53 || uVar51 - uVar53 == 0) goto LAB_005f5e22;
                local_190 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            CONCAT44(local_190._4_4_,paVar48[uVar53].x);
                local_130 = (MatIndexArray *)CONCAT44(local_130._4_4_,paVar48[uVar53].y);
                local_170 = CONCAT44(local_170._4_4_,paVar48[uVar53].z);
                local_178 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            CONCAT44(local_178._4_4_,paVar10[uVar53].x);
                local_150 = CONCAT44(local_150._4_4_,paVar10[uVar53].y);
                local_168 = (aiFace *)CONCAT44(local_168._4_4_,paVar10[uVar53].z);
                count = 0;
                puVar43 = MeshGeometry::ToOutputVertexIndex(geo,piVar42[uVar53],&count);
                if (count != 0) {
                  uVar51 = 0;
                  do {
                    outIndex = puVar43[uVar51];
                    p_Var49 = &p_Var3->_M_header;
                    for (p_Var17 = translateIndexMap._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent; (_Rb_tree_header *)p_Var17 != (_Rb_tree_header *)0x0;
                        p_Var17 = (&p_Var17->_M_left)[bVar59]) {
                      bVar59 = (uint)*(size_t *)(p_Var17 + 1) < outIndex;
                      if (!bVar59) {
                        p_Var49 = p_Var17;
                      }
                    }
                    p_Var52 = p_Var3;
                    if (((_Rb_tree_header *)p_Var49 != p_Var3) &&
                       (p_Var52 = (_Rb_tree_header *)p_Var49,
                       outIndex < (uint)((_Rb_tree_header *)p_Var49)->_M_node_count)) {
                      p_Var52 = p_Var3;
                    }
                    if (p_Var52 != p_Var3) {
                      pmVar41 = std::
                                map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                ::operator[](&translateIndexMap,&outIndex);
                      uVar58 = *pmVar41;
                      paVar32 = animMesh->mVertices;
                      paVar32[uVar58].x = paVar32[uVar58].x + local_190._0_4_;
                      paVar32[uVar58].y = paVar32[uVar58].y + local_130._0_4_;
                      paVar32[uVar58].z = paVar32[uVar58].z + (float)local_170;
                      paVar32 = animMesh->mNormals;
                      if (paVar32 != (aiVector3D *)0x0) {
                        paVar32[uVar58].x = paVar32[uVar58].x + local_178._0_4_;
                        paVar32[uVar58].y = paVar32[uVar58].y + (float)local_150;
                        paVar32[uVar58].z = paVar32[uVar58].z + local_168._0_4_;
                        paVar32 = animMesh->mNormals;
                        fVar60 = paVar32[uVar58].z * paVar32[uVar58].z +
                                 paVar32[uVar58].x * paVar32[uVar58].x +
                                 paVar32[uVar58].y * paVar32[uVar58].y;
                        if (fVar60 < 0.0) {
                          fVar60 = sqrtf(fVar60);
                        }
                        else {
                          fVar60 = SQRT(fVar60);
                        }
                        if (0.0 < fVar60) {
                          paVar32 = paVar32 + uVar58;
                          fVar60 = 1.0 / fVar60;
                          paVar32->x = paVar32->x * fVar60;
                          paVar32->y = paVar32->y * fVar60;
                          paVar32->z = fVar60 * paVar32->z;
                        }
                      }
                    }
                    uVar51 = uVar51 + 1;
                  } while (uVar51 < count);
                }
                uVar53 = uVar53 + 1;
                piVar42 = (local_138->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start;
                geo = local_180;
              } while (uVar53 < (ulong)((long)(local_138->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data._M_finish - (long)piVar42 >>
                                       2));
            }
            fVar60 = 1.0;
            if (8 < (ulong)((long)(local_188->shapeGeometries).
                                  super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_188->shapeGeometries).
                                 super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start)) {
              fVar60 = local_188->percent / 100.0;
            }
            animMesh->mWeight = fVar60;
            paVar56 = (aiMesh *)
                      animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiAnimMesh*,std::allocator<aiAnimMesh*>>::
              _M_realloc_insert<aiAnimMesh*const&>
                        ((vector<aiAnimMesh*,std::allocator<aiAnimMesh*>> *)&animMeshes,
                         (iterator)
                         animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&animMesh);
            }
            else {
              *animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish = animMesh;
              animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar37 = uVar37 + 1;
          } while (uVar37 < (ulong)((long)(local_188->shapeGeometries).
                                          super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(local_188->shapeGeometries).
                                          super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
      }
      ppaVar24 = animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppaVar25 = animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    }
    if ((long)ppaVar25 - (long)ppaVar24 != 0) {
      uVar37 = (long)ppaVar25 - (long)ppaVar24 >> 3;
      out->mNumAnimMeshes = (uint)uVar37;
      ppaVar46 = (aiAnimMesh **)
                 operator_new__(-(ulong)(uVar37 >> 0x3d != 0) | (long)ppaVar25 - (long)ppaVar24);
      out->mAnimMeshes = ppaVar46;
      if (ppaVar25 != ppaVar24) {
        uVar53 = 0;
        do {
          if ((ulong)((long)animMeshes.
                            super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)animMeshes.
                            super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) <= uVar53) goto LAB_005f5e44;
          out->mAnimMeshes[uVar53] =
               animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar53];
          uVar53 = uVar53 + 1;
        } while (uVar37 + (uVar37 == 0) != uVar53);
      }
    }
    ppaVar18 = (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppaVar19 = (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)animMeshes.
                            super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)animMeshes.
                            super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(tempBinormals.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)tempBinormals.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)tempBinormals.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
    ::~_Rb_tree(&translateIndexMap._M_t);
    if (reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(reverseMapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)reverseMapping.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)reverseMapping.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return (int)((ulong)((long)ppaVar19 - (long)ppaVar18) >> 3) - 1;
  }
LAB_005f5e52:
  __assert_fail("count_faces",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                ,0x50e,
                "unsigned int Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, MatIndexArray::value_type, aiNode *, aiNode *, const aiMatrix4x4 &)"
               );
LAB_005f5e44:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  goto LAB_005f5e52;
}

Assistant:

unsigned int FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &mesh, const Model &model,
                                                            MatIndexArray::value_type index,
                                                            aiNode *parent, aiNode *root_node,
                                                            const aiMatrix4x4 &absolute_transform)
        {
            aiMesh* const out_mesh = SetupEmptyMesh(mesh, parent);

            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();

            const bool process_weights = doc.Settings().readWeights && mesh.DeformerSkin() != nullptr;

            unsigned int count_faces = 0;
            unsigned int count_vertices = 0;

            // count faces
            std::vector<unsigned int>::const_iterator itf = faces.begin();
            for (MatIndexArray::const_iterator it = mindices.begin(),
                end = mindices.end(); it != end; ++it, ++itf)
            {
                if ((*it) != index) {
                    continue;
                }
                ++count_faces;
                count_vertices += *itf;
            }

            ai_assert(count_faces);
            ai_assert(count_vertices);

            // mapping from output indices to DOM indexing, needed to resolve weights or blendshapes
            std::vector<unsigned int> reverseMapping;
            std::map<unsigned int, unsigned int> translateIndexMap;
            if (process_weights || mesh.GetBlendShapes().size() > 0) {
                reverseMapping.resize(count_vertices);
            }

            // allocate output data arrays, but don't fill them yet
            out_mesh->mNumVertices = count_vertices;
            out_mesh->mVertices = new aiVector3D[count_vertices];

            out_mesh->mNumFaces = count_faces;
            aiFace* fac = out_mesh->mFaces = new aiFace[count_faces]();


            // allocate normals
            const std::vector<aiVector3D>& normals = mesh.GetNormals();
            if (normals.size()) {
                ai_assert(normals.size() == vertices.size());
                out_mesh->mNormals = new aiVector3D[vertices.size()];
            }

            // allocate tangents, binormals.
            const std::vector<aiVector3D>& tangents = mesh.GetTangents();
            const std::vector<aiVector3D>* binormals = &mesh.GetBinormals();
            std::vector<aiVector3D> tempBinormals;

            if (tangents.size()) {
                if (!binormals->size()) {
                    if (normals.size()) {
                        // XXX this computes the binormals for the entire mesh, not only
                        // the part for which we need them.
                        tempBinormals.resize(normals.size());
                        for (unsigned int i = 0; i < tangents.size(); ++i) {
                            tempBinormals[i] = normals[i] ^ tangents[i];
                        }

                        binormals = &tempBinormals;
                    }
                    else {
                        binormals = nullptr;
                    }
                }

                if (binormals) {
                    ai_assert(tangents.size() == vertices.size() && binormals->size() == vertices.size());

                    out_mesh->mTangents = new aiVector3D[vertices.size()];
                    out_mesh->mBitangents = new aiVector3D[vertices.size()];
                }
            }

            // allocate texture coords
            unsigned int num_uvs = 0;
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i, ++num_uvs) {
                const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(i);
                if (uvs.empty()) {
                    break;
                }

                out_mesh->mTextureCoords[i] = new aiVector3D[vertices.size()];
                out_mesh->mNumUVComponents[i] = 2;
            }

            // allocate vertex colors
            unsigned int num_vcs = 0;
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i, ++num_vcs) {
                const std::vector<aiColor4D>& colors = mesh.GetVertexColors(i);
                if (colors.empty()) {
                    break;
                }

                out_mesh->mColors[i] = new aiColor4D[vertices.size()];
            }

            unsigned int cursor = 0, in_cursor = 0;

            itf = faces.begin();
            for (MatIndexArray::const_iterator it = mindices.begin(), end = mindices.end(); it != end; ++it, ++itf)
            {
                const unsigned int pcount = *itf;
                if ((*it) != index) {
                    in_cursor += pcount;
                    continue;
                }

                aiFace& f = *fac++;

                f.mNumIndices = pcount;
                f.mIndices = new unsigned int[pcount];
                switch (pcount)
                {
                case 1:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                }
                for (unsigned int i = 0; i < pcount; ++i, ++cursor, ++in_cursor) {
                    f.mIndices[i] = cursor;

                    if (reverseMapping.size()) {
                        reverseMapping[cursor] = in_cursor;
                        translateIndexMap[in_cursor] = cursor;
                    }

                    out_mesh->mVertices[cursor] = vertices[in_cursor];

                    if (out_mesh->mNormals) {
                        out_mesh->mNormals[cursor] = normals[in_cursor];
                    }

                    if (out_mesh->mTangents) {
                        out_mesh->mTangents[cursor] = tangents[in_cursor];
                        out_mesh->mBitangents[cursor] = (*binormals)[in_cursor];
                    }

                    for (unsigned int j = 0; j < num_uvs; ++j) {
                        const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(j);
                        out_mesh->mTextureCoords[j][cursor] = aiVector3D(uvs[in_cursor].x, uvs[in_cursor].y, 0.0f);
                    }

                    for (unsigned int j = 0; j < num_vcs; ++j) {
                        const std::vector<aiColor4D>& cols = mesh.GetVertexColors(j);
                        out_mesh->mColors[j][cursor] = cols[in_cursor];
                    }
                }
            }

            ConvertMaterialForMesh(out_mesh, model, mesh, index);

            if (process_weights) {
                ConvertWeights(out_mesh, model, mesh, absolute_transform, parent, root_node, index, &reverseMapping);
            }

            std::vector<aiAnimMesh*> animMeshes;
            for (const BlendShape* blendShape : mesh.GetBlendShapes()) {
                for (const BlendShapeChannel* blendShapeChannel : blendShape->BlendShapeChannels()) {
                    const std::vector<const ShapeGeometry*>& shapeGeometries = blendShapeChannel->GetShapeGeometries();
                    for (size_t i = 0; i < shapeGeometries.size(); i++) {
                        aiAnimMesh* animMesh = aiCreateAnimMesh(out_mesh);
                        const ShapeGeometry* shapeGeometry = shapeGeometries.at(i);
                        const std::vector<aiVector3D>& vertices = shapeGeometry->GetVertices();
                        const std::vector<aiVector3D>& normals = shapeGeometry->GetNormals();
                        const std::vector<unsigned int>& indices = shapeGeometry->GetIndices();
                        animMesh->mName.Set(FixAnimMeshName(shapeGeometry->Name()));
                        for (size_t j = 0; j < indices.size(); j++) {
                            unsigned int index = indices.at(j);
                            aiVector3D vertex = vertices.at(j);
                            aiVector3D normal = normals.at(j);
                            unsigned int count = 0;
                            const unsigned int* outIndices = mesh.ToOutputVertexIndex(index, count);
                            for (unsigned int k = 0; k < count; k++) {
                                unsigned int outIndex = outIndices[k];
                                if (translateIndexMap.find(outIndex) == translateIndexMap.end())
                                    continue;
                                unsigned int index = translateIndexMap[outIndex];
                                animMesh->mVertices[index] += vertex;
                                if (animMesh->mNormals != nullptr) {
                                    animMesh->mNormals[index] += normal;
                                    animMesh->mNormals[index].NormalizeSafe();
                                }
                            }
                        }
                        animMesh->mWeight = shapeGeometries.size() > 1 ? blendShapeChannel->DeformPercent() / 100.0f : 1.0f;
                        animMeshes.push_back(animMesh);
                    }
                }
            }

            const size_t numAnimMeshes = animMeshes.size();
            if (numAnimMeshes > 0) {
                out_mesh->mNumAnimMeshes = static_cast<unsigned int>(numAnimMeshes);
                out_mesh->mAnimMeshes = new aiAnimMesh*[numAnimMeshes];
                for (size_t i = 0; i < numAnimMeshes; i++) {
                    out_mesh->mAnimMeshes[i] = animMeshes.at(i);
                }
            }

            return static_cast<unsigned int>(meshes.size() - 1);
        }